

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O1

PaError CloseStream(PaStream *s)

{
  PaUtil_TerminateBufferProcessor((PaUtilBufferProcessor *)((long)s + 0x68));
  PaUtil_TerminateStreamRepresentation((PaUtilStreamRepresentation *)s);
  PaAlsaStream_Terminate((PaAlsaStream *)s);
  return 0;
}

Assistant:

static PaError CloseStream( PaStream* s )
{
    PaError result = paNoError;
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /*
        IMPLEMENT ME:
            - additional stream closing + cleanup
    */

    PaUtil_TerminateBufferProcessor( &stream->bufferProcessor );
    PaUtil_TerminateStreamRepresentation( &stream->streamRepresentation );
    PaUtil_FreeMemory( stream );

    return result;
}